

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O3

Arg * __thiscall
fmt::internal::PrintfFormatter<wchar_t>::get_arg
          (Arg *__return_storage_ptr__,PrintfFormatter<wchar_t> *this,wchar_t *s,uint arg_index)

{
  LongLong *pLVar1;
  size_t sVar2;
  FormatError *this_00;
  uint index;
  CStringRef message;
  char *pcVar3;
  
  if (arg_index == 0xffffffff) {
    index = *(uint *)(this + 0x10);
    if ((int)index < 0) {
      pcVar3 = "cannot switch from manual to automatic argument indexing";
      goto LAB_001bf4b1;
    }
    *(uint *)(this + 0x10) = index + 1;
  }
  else {
    if (0 < *(int *)(this + 0x10)) {
      pcVar3 = "cannot switch from automatic to manual argument indexing";
LAB_001bf4b1:
      *(undefined8 *)&__return_storage_ptr__->type = 0;
      *(undefined8 *)&__return_storage_ptr__->field_0x18 = 0;
      (__return_storage_ptr__->super_Value).field_0.long_long_value = 0;
      (__return_storage_ptr__->super_Value).field_0.string.size = 0;
      goto LAB_001bf4bd;
    }
    index = arg_index - 1;
    *(undefined4 *)(this + 0x10) = 0xffffffff;
  }
  ArgList::operator[](__return_storage_ptr__,(ArgList *)this,index);
  if (__return_storage_ptr__->type == NAMED_ARG) {
    pLVar1 = (LongLong *)(__return_storage_ptr__->super_Value).field_0.pointer;
    __return_storage_ptr__->type = *(Type *)(pLVar1 + 2);
    sVar2 = pLVar1[1];
    (__return_storage_ptr__->super_Value).field_0.long_long_value = *pLVar1;
    (__return_storage_ptr__->super_Value).field_0.string.size = sVar2;
  }
  else if (__return_storage_ptr__->type == NONE) {
    pcVar3 = "argument index out of range";
LAB_001bf4bd:
    this_00 = (FormatError *)__cxa_allocate_exception(0x10);
    message.data_ = "invalid format string";
    if (*s != L'\0') {
      message.data_ = pcVar3;
    }
    FormatError::FormatError(this_00,message);
    __cxa_throw(this_00,&FormatError::typeinfo,std::runtime_error::~runtime_error);
  }
  return __return_storage_ptr__;
}

Assistant:

Arg fmt::internal::PrintfFormatter<Char>::get_arg(
    const Char *s, unsigned arg_index) {
  (void)s;
  const char *error = 0;
  Arg arg = arg_index == UINT_MAX ?
    next_arg(error) : FormatterBase::get_arg(arg_index - 1, error);
  if (error)
    FMT_THROW(FormatError(!*s ? "invalid format string" : error));
  return arg;
}